

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O3

UObject * __thiscall
icu_63::BasicCalendarFactory::create
          (BasicCalendarFactory *this,ICUServiceKey *key,ICUService *param_2,UErrorCode *status)

{
  byte bVar1;
  int32_t iVar2;
  uint uVar3;
  int iVar4;
  Calendar *pCVar5;
  undefined4 uVar6;
  uint srcStart;
  uint srcLength;
  char **ppcVar7;
  int i;
  undefined4 uVar8;
  long lVar9;
  bool bVar10;
  UnicodeString str;
  UnicodeString calendarKeyword;
  char keyword [157];
  Locale canLoc;
  Locale curLoc;
  ConstChar16Ptr local_320;
  char16_t *local_318;
  UnicodeString local_308;
  UnicodeString local_2c8;
  char local_288 [160];
  Locale local_1e8;
  Locale local_108;
  
  Locale::Locale(&local_108);
  Locale::Locale(&local_1e8);
  (*(key->super_UObject)._vptr_UObject[0xc])(key,&local_108);
  (*(key->super_UObject)._vptr_UObject[0xb])(key,&local_1e8);
  local_308.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_00487e70;
  local_308.fUnion.fStackFields.fLengthAndFlags = 2;
  (*(key->super_UObject)._vptr_UObject[5])(key);
  local_320.p_ = L"calendar=";
  icu_63::UnicodeString::UnicodeString(&local_2c8,'\x01',&local_320,-1);
  local_318 = local_320.p_;
  uVar8 = local_2c8.fUnion.fFields.fLength;
  if (-1 < local_2c8.fUnion.fStackFields.fLengthAndFlags) {
    uVar8 = (int)local_2c8.fUnion.fStackFields.fLengthAndFlags >> 5;
  }
  uVar6 = local_308.fUnion.fFields.fLength;
  if (-1 < local_308.fUnion.fStackFields.fLengthAndFlags) {
    uVar6 = (int)local_308.fUnion.fStackFields.fLengthAndFlags >> 5;
  }
  iVar2 = icu_63::UnicodeString::doIndexOf(&local_308,L'=',0,uVar6);
  uVar6 = local_308.fUnion.fFields.fLength;
  if (-1 < local_308.fUnion.fStackFields.fLengthAndFlags) {
    uVar6 = (int)local_308.fUnion.fStackFields.fLengthAndFlags >> 5;
  }
  if (uVar6 == 0) {
LAB_00255f81:
    lVar9 = 0;
  }
  else {
    if (((int)local_308.fUnion.fStackFields.fLengthAndFlags & 2U) != 0) {
      local_308.fUnion.fFields.fArray = local_308.fUnion.fStackFields.fBuffer;
    }
    if (*local_308.fUnion.fFields.fArray != L'@') goto LAB_00255f81;
    if ((local_2c8.fUnion.fStackFields.fLengthAndFlags & 1U) == 0) {
      if (-1 < local_2c8.fUnion.fStackFields.fLengthAndFlags) {
        local_2c8.fUnion.fFields.fLength = (int)local_2c8.fUnion.fStackFields.fLengthAndFlags >> 5;
      }
      srcStart = local_2c8.fUnion.fFields.fLength >> 0x1f & local_2c8.fUnion.fFields.fLength;
      uVar3 = local_2c8.fUnion.fFields.fLength - srcStart;
      if ((int)uVar8 <= (int)uVar3) {
        uVar3 = uVar8;
      }
      srcLength = 0;
      if (-1 < (int)uVar8) {
        srcLength = uVar3;
      }
      if ((local_2c8.fUnion.fStackFields.fLengthAndFlags & 2U) != 0) {
        local_2c8.fUnion.fFields.fArray = local_2c8.fUnion.fStackFields.fBuffer;
      }
      bVar1 = icu_63::UnicodeString::doCompare
                        (&local_308,1,iVar2,local_2c8.fUnion.fFields.fArray,srcStart,srcLength);
    }
    else {
      bVar1 = ~(byte)local_308.fUnion.fStackFields.fLengthAndFlags & 1;
    }
    if (bVar1 != 0) goto LAB_00255f81;
    if (-1 < local_308.fUnion.fStackFields.fLengthAndFlags) {
      local_308.fUnion.fFields.fLength = (int)local_308.fUnion.fStackFields.fLengthAndFlags >> 5;
    }
    iVar2 = icu_63::UnicodeString::extract
                      (&local_308,iVar2 + 1,local_308.fUnion.fFields.fLength,local_288,0x9d,
                       kInvariant);
    lVar9 = (long)iVar2;
  }
  local_288[lVar9] = '\0';
  icu_63::UnicodeString::~UnicodeString(&local_2c8);
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    ppcVar7 = gCalTypes;
    lVar9 = 0;
    do {
      iVar4 = uprv_stricmp_63(local_288,*(char **)((long)gCalTypes + lVar9));
      if (iVar4 == 0) break;
      bVar10 = lVar9 != 0x88;
      lVar9 = lVar9 + 8;
    } while (bVar10);
    if (iVar4 == 0) {
      lVar9 = 0;
      do {
        iVar4 = uprv_stricmp_63(local_288,*ppcVar7);
        if (iVar4 == 0) goto LAB_00256037;
        lVar9 = lVar9 + 1;
        ppcVar7 = ppcVar7 + 1;
      } while (lVar9 != 0x12);
      lVar9 = 0xffffffff;
LAB_00256037:
      pCVar5 = createStandardCalendar((ECalType)lVar9,&local_1e8,status);
      goto LAB_00255fd2;
    }
  }
  pCVar5 = (Calendar *)0x0;
LAB_00255fd2:
  icu_63::UnicodeString::~UnicodeString(&local_308);
  Locale::~Locale(&local_1e8);
  Locale::~Locale(&local_108);
  return &pCVar5->super_UObject;
}

Assistant:

virtual UObject* create(const ICUServiceKey& key, const ICUService* /*service*/, UErrorCode& status) const {
#ifdef U_DEBUG_CALSVC
        if(dynamic_cast<const LocaleKey*>(&key) == NULL) {
            fprintf(stderr, "::create - not a LocaleKey!\n");
        }
#endif
        const LocaleKey& lkey = (LocaleKey&)key;
        Locale curLoc;  // current locale
        Locale canLoc;  // Canonical locale

        lkey.currentLocale(curLoc);
        lkey.canonicalLocale(canLoc);

        char keyword[ULOC_FULLNAME_CAPACITY];
        UnicodeString str;

        key.currentID(str);
        getCalendarKeyword(str, keyword, (int32_t) sizeof(keyword));

#ifdef U_DEBUG_CALSVC
        fprintf(stderr, "BasicCalendarFactory::create() - cur %s, can %s\n", (const char*)curLoc.getName(), (const char*)canLoc.getName());
#endif

        if(!isStandardSupportedKeyword(keyword,status)) {  // Do we handle this type?
#ifdef U_DEBUG_CALSVC

            fprintf(stderr, "BasicCalendarFactory - not handling %s.[%s]\n", (const char*) curLoc.getName(), tmp );
#endif
            return NULL;
        }

        return createStandardCalendar(getCalendarType(keyword), canLoc, status);
    }